

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::VerifyMarkRoots(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  GuestArenaAllocator *pGVar4;
  ArenaData **ppAVar5;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *pSVar6;
  uint uVar7;
  ulong uVar8;
  Iterator local_50;
  undefined1 local_40 [8];
  Iterator guestArenaIter;
  
  VerifyMark(this,(void *)0x0,this->transientPinnedObject);
  uVar7 = (this->pinnedObjectMap).size;
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  if (uVar7 != 0) {
    uVar8 = 0;
    do {
      pSVar6 = (this->pinnedObjectMap).table[uVar8];
      if (pSVar6 != (EntryType *)0x0) {
        do {
          if ((pSVar6->value).refCount == 0) {
            if (this->hasPendingUnpinnedObject == false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar3 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                                 ,0x212d,"(this->hasPendingUnpinnedObject)",
                                 "this->hasPendingUnpinnedObject");
              if (!bVar2) goto LAB_00718757;
              *puVar3 = 0;
            }
          }
          else {
            VerifyMark(this,(void *)0x0,pSVar6->key);
          }
          pSVar6 = pSVar6->next;
        } while (pSVar6 != (SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> *)0x0);
        uVar7 = (this->pinnedObjectMap).size;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar7);
  }
  local_40 = (undefined1  [8])&this->guestArenaList;
  guestArenaIter.list = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)local_40;
LAB_007185fb:
  if (guestArenaIter.list == (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar2) goto LAB_00718757;
    *puVar3 = 0;
  }
  guestArenaIter.list =
       ((guestArenaIter.list)->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list
  ;
  if ((undefined1  [8])guestArenaIter.list == local_40) {
    guestArenaIter.list = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
    local_50.list = &this->externalGuestArenaList;
    local_50.current = &(local_50.list)->super_DListNodeBase<Memory::ArenaData_*>;
    goto LAB_007186e3;
  }
  pGVar4 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                     ((Iterator *)local_40);
  if (pGVar4->pendingDelete == true) {
    if (this->hasPendingDeleteGuestArena == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x213c,"(this->hasPendingDeleteGuestArena)",
                         "this->hasPendingDeleteGuestArena");
      if (!bVar2) goto LAB_00718757;
      *puVar3 = 0;
    }
  }
  else {
    pGVar4 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_40);
    VerifyMarkArena(this,&(pGVar4->super_ArenaAllocator).
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          super_ArenaData);
  }
  goto LAB_007185fb;
LAB_007186e3:
  if ((DListBase<Memory::ArenaData_*,_RealCount> *)local_50.current ==
      (DListBase<Memory::ArenaData_*,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar2) {
LAB_00718757:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_50.current =
       (((DListBase<Memory::ArenaData_*,_RealCount> *)local_50.current)->
       super_DListNodeBase<Memory::ArenaData_*>).next.base;
  if ((DListBase<Memory::ArenaData_*,_RealCount> *)local_50.current == local_50.list) {
    return;
  }
  ppAVar5 = DListBase<Memory::ArenaData_*,_RealCount>::Iterator::Data(&local_50);
  VerifyMarkArena(this,*ppAVar5);
  goto LAB_007186e3;
}

Assistant:

void
Recycler::VerifyMarkRoots()
{
    {
        this->VerifyMark(transientPinnedObject);
        pinnedObjectMap.Map([this](void * obj, PinRecord const &refCount)
        {
            if (refCount == 0)
            {
                Assert(this->hasPendingUnpinnedObject);
            }
            else
            {
                // Use the pinrecord as the source reference
                this->VerifyMark(obj);
            }
        });
    }

    DList<GuestArenaAllocator, HeapAllocator>::Iterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        if (guestArenaIter.Data().pendingDelete)
        {
            Assert(this->hasPendingDeleteGuestArena);
        }
        else
        {
            VerifyMarkArena(&guestArenaIter.Data());
        }
    }

    DList<ArenaData *, HeapAllocator>::Iterator externalGuestArenaIter(&externalGuestArenaList);
    while (externalGuestArenaIter.Next())
    {
        VerifyMarkArena(externalGuestArenaIter.Data());
    }

    // We can't check external roots here
}